

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  TestResult *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ostream *poVar3;
  size_t width;
  size_t width_00;
  size_t width_01;
  TimeInMillis ms;
  TimeInMillis ms_00;
  _Alloc_hider _Var4;
  char *pcVar5;
  undefined1 local_b0 [8];
  string kTestsuite;
  string kIndent;
  string local_50;
  allocator<char> local_2a;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"testcase",(allocator<char> *)(kTestsuite.field_2._M_local_buf + 8))
  ;
  Indent_abi_cxx11_((string *)((long)&kTestsuite.field_2 + 8),(internal *)0xa,width);
  Indent_abi_cxx11_(&local_50,(internal *)0x8,width_00);
  poVar3 = std::operator<<(stream,(string *)&local_50);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"name",&local_29);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kIndent.field_2._M_local_buf + 8),(test_info->name_)._M_dataplus._M_p,
             &local_2a);
  OutputJsonKey(stream,(string *)local_b0,&local_50,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuite.field_2 + 8),true);
  std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  pbVar1 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"value_param",&local_29);
    pbVar1 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var4._M_p = (char *)0x0;
    }
    else {
      _Var4._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kIndent.field_2._M_local_buf + 8),_Var4._M_p,&local_2a);
    OutputJsonKey(stream,(string *)local_b0,&local_50,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
  }
  pbVar1 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"type_param",&local_29);
    pbVar1 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var4._M_p = (char *)0x0;
    }
    else {
      _Var4._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kIndent.field_2._M_local_buf + 8),_Var4._M_p,&local_2a);
    OutputJsonKey(stream,(string *)local_b0,&local_50,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"file",&local_29);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kIndent.field_2._M_local_buf + 8),
             (test_info->location_).file._M_dataplus._M_p,&local_2a);
  OutputJsonKey(stream,(string *)local_b0,&local_50,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuite.field_2 + 8),true);
  std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"line",(allocator<char> *)(kIndent.field_2._M_local_buf + 8));
  OutputJsonKey(stream,(string *)local_b0,&local_50,(test_info->location_).line,
                (string *)((long)&kTestsuite.field_2 + 8),false);
  std::__cxx11::string::~string((string *)&local_50);
  if (FLAGS_gtest_list_tests == '\x01') {
    poVar3 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&local_50,(internal *)0x8,width_01);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    std::operator<<(poVar3,"}");
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::operator<<(stream,",\n");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"status",&local_29);
    pcVar5 = "NOTRUN";
    if (test_info->should_run_ != false) {
      pcVar5 = "RUN";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kIndent.field_2._M_local_buf + 8),pcVar5,&local_2a);
    OutputJsonKey(stream,(string *)local_b0,&local_50,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"result",&local_29);
    this = &test_info->result_;
    if (test_info->should_run_ == true) {
      bVar2 = TestResult::Skipped(this);
      pcVar5 = "COMPLETED";
      if (bVar2) {
        pcVar5 = "SKIPPED";
      }
    }
    else {
      pcVar5 = "SUPPRESSED";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kIndent.field_2._M_local_buf + 8),pcVar5,&local_2a);
    OutputJsonKey(stream,(string *)local_b0,&local_50,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"timestamp",&local_29);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              ((string *)((long)&kIndent.field_2 + 8),
               (internal *)(test_info->result_).start_timestamp_,ms);
    OutputJsonKey(stream,(string *)local_b0,&local_50,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"time",&local_29);
    FormatTimeInMillisAsDuration_abi_cxx11_
              ((string *)((long)&kIndent.field_2 + 8),(internal *)(test_info->result_).elapsed_time_
               ,ms_00);
    OutputJsonKey(stream,(string *)local_b0,&local_50,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"classname",&local_29);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kIndent.field_2._M_local_buf + 8),test_suite_name,&local_2a);
    OutputJsonKey(stream,(string *)local_b0,&local_50,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),false);
    std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    TestPropertiesAsJson(&local_50,this,(string *)((long)&kTestsuite.field_2 + 8));
    std::operator<<(stream,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    OutputJsonTestResult(stream,this);
  }
  std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }

  OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
  OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
  if (GTEST_FLAG_GET(list_tests)) {
    *stream << "\n" << Indent(8) << "}";
    return;
  } else {
    *stream << ",\n";
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  OutputJsonTestResult(stream, result);
}